

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O2

void __thiscall hwnet::util::TimerMgr::~TimerMgr(TimerMgr *this)

{
  vector<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_> *this_00;
  size_t i;
  ulong uVar1;
  __shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2> local_48;
  
  this_00 = &this->elements;
  for (uVar1 = 0; uVar1 < this->elements_size; uVar1 = uVar1 + 1) {
    std::function<void_(const_std::shared_ptr<hwnet::util::Timer>_&)>::operator=
              (&(this_00->
                super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>).
                _M_impl.super__Vector_impl_data._M_start[uVar1]->mCallback,(nullptr_t)0x0);
    local_48._M_ptr = (element_type *)0x0;
    local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&((this_00->
                 super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar1]->selfPtr).
                super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>,&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  }
  std::_Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>::~_Vector_base
            (&this_00->
              super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->empty_element_ptr).
              super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

~TimerMgr(){
		for(size_t i = 0; i < this->elements_size;i++) {
			this->elements[i]->mCallback = nullptr;
			this->elements[i]->selfPtr = nullptr;
		}
	}